

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedSSOAtomicCounters::Run(AdvancedSSOAtomicCounters *this)

{
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  bool bVar5;
  GLuint GVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float *data;
  int row;
  long lVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  int h;
  vec4 *expected;
  long lVar15;
  long lVar16;
  undefined4 uVar17;
  undefined8 local_88;
  undefined8 uStack_80;
  vec4 zero;
  mat4 identity;
  
  bVar5 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,1);
  lVar15 = 0x10;
  if (bVar5) {
    lVar16 = 0;
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
    GVar6 = ShaderImageLoadStoreBase::BuildShaderProgram
                      (&this->super_ShaderImageLoadStoreBase,0x8b31,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(location = 1) in vec4 i_color;\nlayout(location = 3) out vec4 o_color;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nlayout(std140) uniform Transform {\n  mat4 mvp;\n} g_transform;\nwriteonly uniform imageBuffer g_buffer;\nlayout(binding = 0, offset = 0) uniform atomic_uint g_counter;\nvoid main() {\n  gl_Position = g_transform.mvp * i_position;\n  o_color = i_color;\n  const uint index = atomicCounterIncrement(g_counter);\n  imageStore(g_buffer, int(index), gl_Position);\n}"
                      );
    this->m_vsp = GVar6;
    GVar6 = ShaderImageLoadStoreBase::BuildShaderProgram
                      (&this->super_ShaderImageLoadStoreBase,0x8b30,
                       "#version 420 core\nlayout(location = 3) in vec4 i_color;\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = i_color;\n}"
                      );
    this->m_fsp = GVar6;
    this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,1,this->m_vsp);
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,2,this->m_fsp);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x40,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_buffer_tex);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,this->m_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->m_counter_buffer);
    zero.m_data[0] = 0.0;
    zero.m_data[1] = 0.0;
    zero.m_data[2] = 0.0;
    zero.m_data[3] = 0.0;
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,&zero,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,this->m_transform_buffer);
    pfVar9 = (float *)&identity;
    identity.m_data.m_data[3].m_data[0] = 0.0;
    identity.m_data.m_data[3].m_data[1] = 0.0;
    identity.m_data.m_data[3].m_data[2] = 0.0;
    identity.m_data.m_data[3].m_data[3] = 0.0;
    identity.m_data.m_data[2].m_data[0] = 0.0;
    identity.m_data.m_data[2].m_data[1] = 0.0;
    identity.m_data.m_data[2].m_data[2] = 0.0;
    identity.m_data.m_data[2].m_data[3] = 0.0;
    identity.m_data.m_data[1].m_data[0] = 0.0;
    identity.m_data.m_data[1].m_data[1] = 0.0;
    identity.m_data.m_data[1].m_data[2] = 0.0;
    identity.m_data.m_data[1].m_data[3] = 0.0;
    identity.m_data.m_data[0].m_data[0] = 0.0;
    identity.m_data.m_data[0].m_data[1] = 0.0;
    identity.m_data.m_data[0].m_data[2] = 0.0;
    identity.m_data.m_data[0].m_data[3] = 0.0;
    lVar15 = 0;
    do {
      lVar10 = 0;
      do {
        uVar17 = 0x3f800000;
        if (lVar16 != lVar10) {
          uVar17 = 0;
        }
        *(undefined4 *)((long)pfVar9 + lVar10) = uVar17;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      lVar15 = lVar15 + 1;
      pfVar9 = pfVar9 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar15 != 4);
    glu::CallLogWrapper::glBufferData(this_00,0x8a11,0x40,&identity,0x88e4);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->m_counter_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,0,this->m_transform_buffer);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_buffer_tex,0,'\0',0,0x88ba,0x8814);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
    glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_pipeline);
    h = 1;
    expected = (vec4 *)0x0;
    glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(this_00,5,0,4,1,0);
    iVar7 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar7 = *(int *)CONCAT44(extraout_var,iVar7);
    iVar8 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_88 = 0x3f80000000000000;
    uStack_80 = 0x3f80000000000000;
    bVar5 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&this->super_ShaderImageLoadStoreBase,iVar7,
                       *(int *)(CONCAT44(extraout_var_00,iVar8) + 4),(int)&local_88,h,expected);
    lVar15 = -1;
    if (bVar5) {
      data = (float *)operator_new(0x40);
      data[0] = 0.0;
      data[1] = 0.0;
      data[2] = 0.0;
      data[3] = 0.0;
      data[4] = 0.0;
      data[5] = 0.0;
      data[6] = 0.0;
      data[7] = 0.0;
      data[8] = 0.0;
      data[9] = 0.0;
      data[10] = 0.0;
      data[0xb] = 0.0;
      data[0xc] = 0.0;
      data[0xd] = 0.0;
      data[0xe] = 0.0;
      data[0xf] = 0.0;
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
      uVar13 = 0x8c2a;
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c2a,0,0x40,data);
      bVar5 = true;
      lVar15 = 0;
      pfVar9 = data;
      do {
        fVar3 = *pfVar9;
        fVar4 = pfVar9[1];
        auVar1._4_4_ = -(uint)(fVar4 == -1.0);
        auVar1._0_4_ = -(uint)(fVar3 == -1.0);
        auVar1._8_4_ = -(uint)(pfVar9[2] == 0.0);
        auVar1._12_4_ = -(uint)(pfVar9[3] == 1.0);
        uVar12 = movmskps((int)uVar13,auVar1);
        uVar13 = (ulong)uVar12;
        if (uVar12 != 0xf) {
          auVar2._4_4_ = -(uint)(fVar4 == -1.0);
          auVar2._0_4_ = -(uint)(fVar3 == -1.0);
          auVar2._8_4_ = -(uint)(pfVar9[2] == 0.0);
          auVar2._12_4_ = -(uint)(pfVar9[3] == 1.0);
          uVar12 = movmskps(uVar12,auVar2);
          bVar14 = (byte)uVar12 >> 3;
          bVar11 = (byte)((ulong)uVar12 & 0xffffffffffffff04) >> 2;
          uVar13 = CONCAT71((int7)(((ulong)uVar12 & 0xffffffffffffff04) >> 8),bVar11);
          if ((((fVar3 == 1.0 & (byte)uVar12 >> 1 & bVar11 & bVar14) == 0) &&
              ((-(fVar4 == 1.0) & -(fVar3 == -1.0) & bVar11 & bVar14) == 0)) &&
             ((-(fVar3 == 1.0) & -(fVar4 == 1.0) & bVar14 & bVar11) != 1)) break;
        }
        bVar5 = (uint)lVar15 < 3;
        lVar15 = lVar15 + 1;
        pfVar9 = pfVar9 + 4;
      } while (lVar15 != 4);
      lVar15 = -(ulong)bVar5;
      operator_delete(data,0x40);
    }
  }
  return lVar15;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);
		const char* const glsl_vs =
			"#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
			"layout(location = 1) in vec4 i_color;" NL "layout(location = 3) out vec4 o_color;" NL
			"out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "layout(std140) uniform Transform {" NL
			"  mat4 mvp;" NL "} g_transform;" NL "writeonly uniform imageBuffer g_buffer;" NL
			"layout(binding = 0, offset = 0) uniform atomic_uint g_counter;" NL "void main() {" NL
			"  gl_Position = g_transform.mvp * i_position;" NL "  o_color = i_color;" NL
			"  const uint index = atomicCounterIncrement(g_counter);" NL
			"  imageStore(g_buffer, int(index), gl_Position);" NL "}";
		const char* const glsl_fs =
			"#version 420 core" NL "layout(location = 3) in vec4 i_color;" NL
			"layout(location = 0) out vec4 o_color;" NL "void main() {" NL "  o_color = i_color;" NL "}";
		m_vsp = BuildShaderProgram(GL_VERTEX_SHADER, glsl_vs);
		m_fsp = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs);

		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);

		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glBufferData(GL_TEXTURE_BUFFER, sizeof(vec4) * 4, NULL, GL_STATIC_DRAW);

		glBindTexture(GL_TEXTURE_BUFFER, m_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_buffer);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counter_buffer);
		vec4 zero(0);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), &zero, GL_STATIC_DRAW);

		glBindBuffer(GL_UNIFORM_BUFFER, m_transform_buffer);
		mat4 identity(1);
		glBufferData(GL_UNIFORM_BUFFER, sizeof(mat4), &identity, GL_STATIC_DRAW);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer);
		glBindBufferBase(GL_UNIFORM_BUFFER, 0, m_transform_buffer);
		glBindImageTexture(0, m_buffer_tex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindVertexArray(m_vao);
		glBindProgramPipeline(m_pipeline);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLE_STRIP, 0, 4, 1, 0);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}

		std::vector<vec4> data(4);
		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glGetBufferSubData(GL_TEXTURE_BUFFER, 0, sizeof(vec4) * 4, &data[0]);

		for (int i = 0; i < 4; ++i)
		{
			if (!IsEqual(data[i], vec4(-1.0f, -1.0f, 0.0f, 1.0f)) && !IsEqual(data[i], vec4(1.0f, -1.0f, 0.0f, 1.0f)) &&
				!IsEqual(data[i], vec4(-1.0f, 1.0f, 0.0f, 1.0f)) && !IsEqual(data[i], vec4(1.0f, 1.0f, 0.0f, 1.0f)))
			{
				return ERROR;
			}
		}

		return NO_ERROR;
	}